

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.cc
# Opt level: O3

int BIO_read_asn1(BIO *bio,uint8_t **out,size_t *out_len,size_t max_len)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint8_t *puVar4;
  ushort *puVar5;
  ulong uVar6;
  size_t sVar7;
  int line;
  char cVar8;
  undefined2 *data;
  size_t __n;
  byte *data_00;
  ulong uVar9;
  bool bVar10;
  uint8_t header [6];
  undefined2 local_4e;
  byte local_4c [4];
  ulong local_48;
  uint8_t **local_40;
  size_t *local_38;
  
  data = &local_4e;
  uVar1 = BIO_read((BIO *)bio,data,2);
  uVar2 = uVar1;
  if (0 < (int)uVar1) {
    uVar9 = 2;
    local_48 = max_len;
    local_38 = out_len;
    do {
      uVar9 = uVar9 - uVar2;
      if (uVar9 == 0) {
        if ((~(byte)local_4e & 0x1f) == 0) {
          iVar3 = 0x6d;
          line = 0x1e9;
          goto LAB_001bc2d9;
        }
        uVar9 = (ulong)local_4e._1_1_;
        if (-1 < (short)local_4e) {
          __n = 2;
          goto LAB_001bc02f;
        }
        uVar9 = (ulong)(local_4e._1_1_ & 0x7f);
        cVar8 = (char)(local_4e._1_1_ & 0x7f);
        local_40 = out;
        if (((local_4e & 0x20) == 0) || (cVar8 != '\0')) {
          if ((byte)(cVar8 - 5U) < 0xfc) {
            iVar3 = 0x6d;
            line = 0x200;
            goto LAB_001bc2d9;
          }
          data_00 = local_4c;
          uVar6 = uVar9;
          goto LAB_001bc1ff;
        }
        uVar9 = 0x1002;
        if (local_48 < 0x1002) {
          uVar9 = local_48;
        }
        if (local_48 < 2) goto LAB_001bc2be;
        puVar5 = (ushort *)OPENSSL_malloc(uVar9);
        *out = (uint8_t *)puVar5;
        if (puVar5 == (ushort *)0x0) goto LAB_001bc2be;
        *puVar5 = local_4e;
        sVar7 = 2;
        goto LAB_001bc11b;
      }
      data = (undefined2 *)((long)data + (ulong)uVar2);
      iVar3 = 0x7fffffff;
      if (uVar9 < 0x80000000) {
        iVar3 = (int)uVar9;
      }
      uVar2 = BIO_read((BIO *)bio,data,iVar3);
    } while (0 < (int)uVar2);
  }
  if (((int)uVar1 < 1) && (uVar2 == 0)) {
    iVar3 = 0x7b;
    line = 0x1dd;
  }
  else {
    iVar3 = 0xa2;
    line = 0x1df;
  }
  goto LAB_001bc2d9;
  while( true ) {
    data_00 = data_00 + uVar2;
    uVar6 = uVar6 - uVar2;
    if (uVar6 == 0) break;
LAB_001bc1ff:
    iVar3 = 0x7fffffff;
    if (uVar6 < 0x80000000) {
      iVar3 = (int)uVar6;
    }
    uVar2 = BIO_read((BIO *)bio,data_00,iVar3);
    if ((int)uVar2 < 1) {
      iVar3 = 0xa2;
      line = 0x205;
      goto LAB_001bc2d9;
    }
  }
  if (cVar8 != '\0') {
    __n = uVar9 + 2;
    uVar6 = 0;
    uVar2 = 0;
    do {
      uVar2 = (uint)local_4c[uVar6] | uVar2 << 8;
      uVar6 = uVar6 + 1;
    } while (uVar9 != uVar6);
    if (0x7f < uVar2) {
      if (uVar2 >> (local_4e._1_1_ * '\b' - 8 & 0x1f) == 0) {
        iVar3 = 0x6d;
        line = 0x218;
      }
      else {
        uVar9 = (ulong)uVar2;
        out = local_40;
LAB_001bc02f:
        if ((uVar9 < 0x80000000) && (sVar7 = uVar9 + __n, sVar7 <= local_48)) {
          *local_38 = sVar7;
          puVar4 = (uint8_t *)OPENSSL_malloc(sVar7);
          *out = puVar4;
          if (puVar4 == (uint8_t *)0x0) {
            return 0;
          }
          memcpy(puVar4,&local_4e,__n);
          if (uVar9 == 0) {
            return 1;
          }
          puVar4 = *out + __n;
          while( true ) {
            iVar3 = 0x7fffffff;
            if (uVar9 < 0x80000000) {
              iVar3 = (int)uVar9;
            }
            uVar2 = BIO_read((BIO *)bio,puVar4,iVar3);
            if ((int)uVar2 < 1) break;
            puVar4 = puVar4 + uVar2;
            uVar9 = uVar9 - uVar2;
            if (uVar9 == 0) {
              return 1;
            }
          }
          ERR_put_error(0xc,0,0xa2,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/bio.cc"
                        ,0x22c);
          OPENSSL_free(*out);
          return 0;
        }
        iVar3 = 0xb1;
        line = 0x220;
      }
      goto LAB_001bc2d9;
    }
  }
  iVar3 = 0x6d;
  line = 0x212;
  goto LAB_001bc2d9;
LAB_001bc11b:
  uVar6 = uVar9 - sVar7;
  if (uVar6 != 0) {
    if (0x7ffffffe < uVar6) {
      uVar6 = 0x7fffffff;
    }
    iVar3 = BIO_read((BIO *)bio,*out + sVar7,(int)uVar6);
    if (iVar3 == -1) goto LAB_001bc2b5;
    if (iVar3 == 0) {
      *local_38 = sVar7;
      return 1;
    }
    sVar7 = sVar7 + (long)iVar3;
    if ((uVar9 < local_48) && (uVar9 - sVar7 < 0x800)) {
      uVar6 = uVar9 + 0x1000;
      if (local_48 <= uVar9 + 0x1000) {
        uVar6 = local_48;
      }
      bVar10 = 0xffffffffffffefff < uVar9;
      uVar9 = uVar6;
      if (bVar10) {
        uVar9 = local_48;
      }
      puVar4 = (uint8_t *)OPENSSL_realloc(*out,uVar9);
      if (puVar4 == (uint8_t *)0x0) goto LAB_001bc2b5;
      *out = puVar4;
    }
    goto LAB_001bc11b;
  }
LAB_001bc2b5:
  OPENSSL_free(*out);
LAB_001bc2be:
  iVar3 = 0xa2;
  line = 0x1f9;
LAB_001bc2d9:
  ERR_put_error(0xc,0,iVar3,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/bio.cc"
                ,line);
  return 0;
}

Assistant:

int BIO_read_asn1(BIO *bio, uint8_t **out, size_t *out_len, size_t max_len) {
  uint8_t header[6];

  static const size_t kInitialHeaderLen = 2;
  int eof_on_first_read;
  if (!bio_read_full(bio, header, &eof_on_first_read, kInitialHeaderLen)) {
    if (eof_on_first_read) {
      // Historically, OpenSSL returned |ASN1_R_HEADER_TOO_LONG| when
      // |d2i_*_bio| could not read anything. CPython conditions on this to
      // determine if |bio| was empty.
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_HEADER_TOO_LONG);
    } else {
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_NOT_ENOUGH_DATA);
    }
    return 0;
  }

  const uint8_t tag = header[0];
  const uint8_t length_byte = header[1];

  if ((tag & 0x1f) == 0x1f) {
    // Long form tags are not supported.
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_DECODE_ERROR);
    return 0;
  }

  size_t len, header_len;
  if ((length_byte & 0x80) == 0) {
    // Short form length.
    len = length_byte;
    header_len = kInitialHeaderLen;
  } else {
    const size_t num_bytes = length_byte & 0x7f;

    if ((tag & 0x20 /* constructed */) != 0 && num_bytes == 0) {
      // indefinite length.
      if (!bio_read_all(bio, out, out_len, header, kInitialHeaderLen,
                        max_len)) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_NOT_ENOUGH_DATA);
        return 0;
      }
      return 1;
    }

    if (num_bytes == 0 || num_bytes > 4) {
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_DECODE_ERROR);
      return 0;
    }

    if (!bio_read_full(bio, header + kInitialHeaderLen, NULL, num_bytes)) {
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_NOT_ENOUGH_DATA);
      return 0;
    }
    header_len = kInitialHeaderLen + num_bytes;

    uint32_t len32 = 0;
    for (unsigned i = 0; i < num_bytes; i++) {
      len32 <<= 8;
      len32 |= header[kInitialHeaderLen + i];
    }

    if (len32 < 128) {
      // Length should have used short-form encoding.
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_DECODE_ERROR);
      return 0;
    }

    if ((len32 >> ((num_bytes - 1) * 8)) == 0) {
      // Length should have been at least one byte shorter.
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_DECODE_ERROR);
      return 0;
    }

    len = len32;
  }

  if (len + header_len < len || len + header_len > max_len || len > INT_MAX) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_TOO_LONG);
    return 0;
  }
  len += header_len;
  *out_len = len;

  *out = reinterpret_cast<uint8_t *>(OPENSSL_malloc(len));
  if (*out == NULL) {
    return 0;
  }
  OPENSSL_memcpy(*out, header, header_len);
  if (!bio_read_full(bio, (*out) + header_len, NULL, len - header_len)) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_NOT_ENOUGH_DATA);
    OPENSSL_free(*out);
    return 0;
  }

  return 1;
}